

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall CompressedXipReader::~CompressedXipReader(CompressedXipReader *this)

{
  element_type *peVar1;
  iterator __position;
  pointer puVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer puVar5;
  long lVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  ulong uVar10;
  pointer puVar11;
  ByteVector compdata;
  ByteVector data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  uint local_34;
  size_t __n;
  
  (this->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__CompressedXipReader_001458f8;
  peVar1 = (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super_ReadWriter)._vptr_ReadWriter[4])(peVar1,0);
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      iVar8 = (*(((this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_ReadWriter)._vptr_ReadWriter[8])();
      if ((char)iVar8 != '\0') break;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_50,(ulong)this->_fullblocksize,(allocator_type *)&local_34);
      peVar1 = (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar6 = CONCAT44(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       CONCAT22(local_50.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._2_2_,
                                local_50.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_2_));
      uVar9 = (*(peVar1->super_ReadWriter)._vptr_ReadWriter[2])
                        (peVar1,lVar6,
                         (long)local_50.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - lVar6);
      __n = CONCAT44(extraout_var,uVar9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_68,
                 (size_type)
                 (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 ((ulong)this->_fullblocksize -
                 (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start)));
      if (__n != 0) {
        memmove(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + -(ulong)this->_fullblocksize,
                (void *)CONCAT44(local_50.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 CONCAT22(local_50.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                          local_50.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_2_)),__n);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_68,
                 (size_type)
                 (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (__n - (long)(local_68.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + this->_fullblocksize))));
      __position._M_current =
           (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_34 = uVar9;
      if (__position._M_current ==
          (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->_compsizes,__position,&local_34);
      }
      else {
        *__position._M_current = uVar9;
        (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pvVar7 = (void *)CONCAT44(local_50.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                CONCAT22(local_50.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._2_2_,
                                         local_50.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_2_));
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,(long)local_50.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar7);
      }
    }
    puVar11 = (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (*(((this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ReadWriter)._vptr_ReadWriter[6])();
    printf("updated cxip: %d blocks ( full=%x, comp=%x )\n",
           (ulong)((long)puVar2 - (long)puVar11) >> 2 & 0xffffffff,(ulong)uVar9,
           (ulong)(uint)((int)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (int)local_68.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start));
    peVar3 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_ReadWriter[4])(peVar3,0x34);
    peVar3 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         ((uint)((ulong)((long)(this->_compsizes).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_compsizes).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1) & 0xfffffffe) + 0x44;
    (*peVar3->_vptr_ReadWriter[3])(peVar3,&local_50,4);
    peVar3 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar10 = (ulong)((long)(this->_compsizes).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->_compsizes).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_2_ = (undefined2)uVar10;
    local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._2_2_ = (undefined2)(uVar10 >> 0x10);
    (*peVar3->_vptr_ReadWriter[3])(peVar3,&local_50,4);
    peVar3 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_2_ = (undefined2)this->_fullblocksize;
    local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._2_2_ = (undefined2)(this->_fullblocksize >> 0x10);
    (*peVar3->_vptr_ReadWriter[3])(peVar3,&local_50,4);
    peVar3 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_2_ = 0x5253;
    local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._2_2_ = 0x5850;
    (*peVar3->_vptr_ReadWriter[3])(peVar3,&local_50,4);
    puVar11 = (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar11 != puVar2) {
      do {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_2_ = (undefined2)*puVar11;
        peVar3 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar3->_vptr_ReadWriter[3])(peVar3,&local_50,2);
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar2);
    }
    peVar3 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar3->_vptr_ReadWriter[3])
              (peVar3,local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
               (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  p_Var4 = (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  puVar5 = (this->_cache).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)(this->_cache).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
  }
  puVar11 = (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (puVar11 != (pointer)0x0) {
    operator_delete(puVar11,(long)(this->_compsizes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar11)
    ;
  }
  puVar11 = (this->_compptrs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (puVar11 != (pointer)0x0) {
    operator_delete(puVar11,(long)(this->_compptrs).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar11)
    ;
  }
  p_Var4 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  return;
}

Assistant:

virtual ~CompressedXipReader()
    {
        if (!_memrd)
            return;

        // create new compressed data
        _memrd->setpos(0);
        ByteVector compdata;

        while (!_memrd->eof()) {
            ByteVector data(_fullblocksize);
            size_t n= _memrd->read(&data[0], data.size());

            compdata.resize(compdata.size()+_fullblocksize);
            size_t c= compress(&data[0], n, &compdata[compdata.size()-_fullblocksize]);
            compdata.resize(compdata.size()-_fullblocksize+c);

            _compsizes.push_back(c);
        }
        printf("updated cxip: %d blocks ( full=%x, comp=%x )\n", (int)_compsizes.size(), (int)_memrd->size(), (int)compdata.size());

        // write new header
        _r->setpos(0x34);
        _r->write32le(0x44+2*_compsizes.size());
        _r->write32le(_compsizes.size());
        _r->write32le(_fullblocksize);
        _r->write32le(0x58505253);
        std::for_each(_compsizes.begin(), _compsizes.end(), [this](uint32_t c) { _r->write16le(c); });
        _r->write(&compdata[0], compdata.size());
    }